

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-serialization.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int *piVar2;
  ulong uVar3;
  size_type sVar4;
  reference this;
  MemoryBuffer *this_00;
  uint j_1;
  uint i_1;
  vector<PointVec,_std::allocator<PointVec>_> points_3;
  uint j;
  uint i;
  vector<Point,_std::allocator<Point>_> points_2;
  PointVec p_1;
  vector<PointVec,_std::allocator<PointVec>_> points_1;
  Point p;
  vector<Point,_std::allocator<Point>_> points;
  MemoryBuffer bb;
  vector<Point,_std::allocator<Point>_> *in_stack_fffffffffffffe28;
  MemoryBuffer *in_stack_fffffffffffffe30;
  value_type *in_stack_fffffffffffffe38;
  ostream *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe58;
  PointVec *in_stack_fffffffffffffe60;
  uint local_f8;
  uint local_f4;
  vector<PointVec,_std::allocator<PointVec>_> local_f0;
  uint local_d8;
  uint local_d4;
  vector<Point,_std::allocator<Point>_> local_d0 [3];
  Point local_84 [4];
  MemoryBuffer local_50;
  int local_4;
  
  local_4 = 0;
  diy::MemoryBuffer::MemoryBuffer(in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<Point,_std::allocator<Point>_>::vector
            ((vector<Point,_std::allocator<Point>_> *)0x102352);
  piVar2 = Point::operator[](local_84,2);
  *piVar2 = 5;
  piVar2 = Point::operator[](local_84,1);
  *piVar2 = 5;
  piVar2 = Point::operator[](local_84,0);
  *piVar2 = 5;
  std::vector<Point,_std::allocator<Point>_>::push_back
            ((vector<Point,_std::allocator<Point>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  piVar2 = Point::operator[](local_84,0);
  *piVar2 = 1;
  std::vector<Point,_std::allocator<Point>_>::push_back
            ((vector<Point,_std::allocator<Point>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  piVar2 = Point::operator[](local_84,2);
  *piVar2 = 1;
  std::vector<Point,_std::allocator<Point>_>::push_back
            ((vector<Point,_std::allocator<Point>_> *)in_stack_fffffffffffffe40,
             (value_type *)in_stack_fffffffffffffe38);
  diy::save<std::vector<Point,std::allocator<Point>>>
            (&in_stack_fffffffffffffe30->super_BinaryBuffer,in_stack_fffffffffffffe28);
  std::vector<Point,_std::allocator<Point>_>::~vector
            ((vector<Point,_std::allocator<Point>_> *)in_stack_fffffffffffffe40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<PointVec,_std::allocator<PointVec>_>::vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)0x1024e6);
  PointVec::PointVec(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  piVar2 = PointVec::operator[]
                     ((PointVec *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  *piVar2 = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  piVar2 = PointVec::operator[]
                     ((PointVec *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  *piVar2 = 2;
  std::vector<PointVec,_std::allocator<PointVec>_>::push_back
            ((vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe40,
             in_stack_fffffffffffffe38);
  diy::save<std::vector<PointVec,std::allocator<PointVec>>>
            (&in_stack_fffffffffffffe30->super_BinaryBuffer,
             (vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe28);
  PointVec::~PointVec((PointVec *)0x1025b6);
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  diy::MemoryBuffer::reset(&local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<Point,_std::allocator<Point>_>::vector
            ((vector<Point,_std::allocator<Point>_> *)0x102676);
  diy::load<std::vector<Point,std::allocator<Point>>>
            (&in_stack_fffffffffffffe30->super_BinaryBuffer,in_stack_fffffffffffffe28);
  local_d4 = 0;
  while( true ) {
    uVar3 = (ulong)local_d4;
    sVar4 = std::vector<Point,_std::allocator<Point>_>::size(local_d0);
    if (sVar4 <= uVar3) break;
    for (local_d8 = 0; local_d8 < 3; local_d8 = local_d8 + 1) {
      this = std::vector<Point,_std::allocator<Point>_>::operator[](local_d0,(ulong)local_d4);
      piVar2 = Point::operator[](this,local_d8);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2);
      std::operator<<(poVar1,' ');
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_d4 = local_d4 + 1;
  }
  std::vector<Point,_std::allocator<Point>_>::~vector
            ((vector<Point,_std::allocator<Point>_> *)in_stack_fffffffffffffe40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<PointVec,_std::allocator<PointVec>_>::vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)0x102884);
  diy::load<std::vector<PointVec,std::allocator<PointVec>>>
            (&in_stack_fffffffffffffe30->super_BinaryBuffer,
             (vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe28);
  local_f4 = 0;
  while( true ) {
    sVar4 = std::vector<PointVec,_std::allocator<PointVec>_>::size(&local_f0);
    if (sVar4 <= local_f4) break;
    for (local_f8 = 0; local_f8 < 3; local_f8 = local_f8 + 1) {
      std::vector<PointVec,_std::allocator<PointVec>_>::operator[](&local_f0,(ulong)local_f4);
      piVar2 = PointVec::operator[]
                         ((PointVec *)in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe40 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar2)
      ;
      std::operator<<(in_stack_fffffffffffffe40,' ');
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_f4 = local_f4 + 1;
  }
  std::vector<PointVec,_std::allocator<PointVec>_>::~vector
            ((vector<PointVec,_std::allocator<PointVec>_> *)in_stack_fffffffffffffe40);
  poVar1 = std::operator<<((ostream *)&std::cout,"Position: ");
  this_00 = (MemoryBuffer *)std::ostream::operator<<(poVar1,local_50.position);
  std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
  diy::MemoryBuffer::~MemoryBuffer(this_00);
  return local_4;
}

Assistant:

int main()
{
  diy::MemoryBuffer bb;
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    Point p; p[0] = p[1] = p[2] = 5;
    points.push_back(p);
    p[0] = 1;
    points.push_back(p);
    p[2] = 1;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    PointVec p(3);
    points.push_back(p);
    p[0] = 2;
    points.push_back(p);
    p[2] = 2;
    points.push_back(p);

    save(bb, points);
  }
  std::cout << "Position: " << bb.position << std::endl;

  bb.reset();
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<Point>    points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;

  {
    std::vector<PointVec> points;
    load(bb, points);
    for (unsigned i = 0; i < points.size(); ++i)
    {
      for (unsigned j = 0; j < 3; ++j)
        std::cout << points[i][j] << ' ';
      std::cout << std::endl;
    }
  }
  std::cout << "Position: " << bb.position << std::endl;
}